

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_on_open_client(intptr_t uuid,void *set_)

{
  void *set__local;
  intptr_t uuid_local;
  
  http_on_open_client_http1(uuid,set_,(void *)0x0);
  return;
}

Assistant:

static void http_on_open_client(intptr_t uuid, void *set_) {
  http_on_open_client_http1(uuid, set_, NULL);
}